

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

node_type * __thiscall
phmap::priv::
btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,_std::allocator<int>,_256,_false>_>
::new_internal_node(btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,_std::allocator<int>,_256,_false>_>
                    *this,node_type *parent)

{
  size_type n;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,_std::allocator<int>,_256,_false>_>
  *n_00;
  template_ElementType<1UL> *ptVar1;
  
  n = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,_std::allocator<int>,_256,_false>_>
      ::InternalSize();
  n_00 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,_std::allocator<int>,_256,_false>_>
          *)Allocate<8ul,std::allocator<int>>((allocator<int> *)this,n);
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,_std::allocator<int>,_256,_false>_>
  ::init_leaf(n_00,parent,0x3d);
  ptVar1 = btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,std::allocator<int>,256,false>>
           ::GetField<1ul>((btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,std::allocator<int>,256,false>>
                            *)n_00);
  ptVar1[3] = '\0';
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,_std::allocator<int>,_256,_false>_>
  ::mutable_child(n_00,0);
  return n_00;
}

Assistant:

node_type* new_internal_node(node_type *parent) {
            node_type *p = allocate(node_type::InternalSize());
            return node_type::init_internal(p, parent);
        }